

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtest.cc
# Opt level: O3

void test_norm_infinity(GlobalArray *g_a)

{
  int iVar1;
  int iVar2;
  double *value;
  uint uVar3;
  ulong uVar4;
  double dVar5;
  int type;
  float fval;
  int ival;
  double norm_infinity;
  long lval;
  double dval;
  int ndim;
  int dims [7];
  int local_7c;
  float local_78;
  int local_74;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double dStack_50;
  int local_3c;
  int local_38 [8];
  
  local_74 = -2;
  local_60 = -2.0;
  local_78 = -2.0;
  local_68 = -NAN;
  local_70 = -1.0;
  iVar2 = GA_Nodeid();
  GA::GlobalArray::inquire(g_a,&local_7c,&local_3c,local_38);
  local_58 = -2.0;
  dStack_50 = -0.0;
  switch(local_7c) {
  case 0x3e9:
    value = (double *)&local_74;
    break;
  case 0x3ea:
    value = &local_68;
    break;
  case 0x3eb:
    value = (double *)&local_78;
    break;
  case 0x3ec:
    value = &local_60;
    break;
  default:
    GA::GAServices::error
              ((GAServices *)&GA::SERVICES,"test_norm_infinity:wrong data type.",local_7c);
  case 0x3ef:
    value = &local_58;
  }
  if (iVar2 == 0) {
    printf("Testing GA_Norm_infinity...");
  }
  GA::GlobalArray::fill(g_a,value);
  GA::GlobalArray::normInfinity(g_a,&local_70);
  switch(local_7c) {
  case 0x3e9:
    iVar1 = -local_74;
    if (0 < local_74) {
      iVar1 = local_74;
    }
    dVar5 = (double)iVar1;
    break;
  case 0x3ea:
    dVar5 = (double)-(long)local_68;
    if (0 < (long)local_68) {
      dVar5 = local_68;
    }
    dVar5 = (double)(long)dVar5;
    break;
  case 0x3eb:
    uVar3 = -(uint)(-local_78 <= local_78);
    dVar5 = (double)(float)(~uVar3 & (uint)-local_78 | (uint)local_78 & uVar3);
    break;
  case 0x3ec:
    uVar4 = -(ulong)(-local_60 <= local_60);
    dVar5 = (double)(~uVar4 & (ulong)-local_60 | (ulong)local_60 & uVar4);
    break;
  default:
    GA::GAServices::error
              ((GAServices *)&GA::SERVICES,"test_norm_infinity: wrong data type.\n",local_7c);
  case 0x3ef:
    dVar5 = SQRT(local_58 * local_58 + dStack_50 * dStack_50);
  }
  if (iVar2 == 0) {
    dVar5 = dVar5 - local_70;
    uVar4 = -(ulong)(dVar5 < -dVar5);
    if (1e-05 <= (double)(~uVar4 & (ulong)dVar5 | (ulong)-dVar5 & uVar4)) {
      puts("not ok.");
      GA::GAServices::error((GAServices *)&GA::SERVICES,"test_norm_infinity:mismatched.",local_7c);
    }
    puts("ok.");
  }
  return;
}

Assistant:

void
test_norm_infinity (GA::GlobalArray * g_a) {

  void *val;
  int ival = -2;
  double dval = -2.0;
  float fval = -2.0;
  long lval = -2;
  DoubleComplex dcval;

  double norm_infinity = -1.0, result = -1.0;

  int me = GA_Nodeid ();
  int type, ndim, dims[MAXDIM];

  g_a->inquire (&type, &ndim, dims);
  dcval.real = -2.0;
  dcval.imag = -0.0;

  switch (type)
    {
    case C_INT:
      val = (void *)&ival;
      break;
    case C_DCPL:
      val = (void *)&dcval;
      break;
    case C_DBL:
      val = (void *)&dval;
      break;
    case C_FLOAT:
      val =(void *) &fval;
      break;
    case C_LONG:
      val = (void *)&lval;
      break;
    default:
      GA::SERVICES.error ((char *)"test_norm_infinity:wrong data type.", type);
    }

  if (me == 0)
    printf ("Testing GA_Norm_infinity...");
  g_a->fill (val);
  g_a->normInfinity (&norm_infinity);

  // GA_Print(g_a);
  //printf("norm_infinity = %lf\n",norm_infinity);
  switch (type)
    {
    case C_INT:
      result = (double) GA_ABS (ival);
      break;
    case C_LONG:
      result = (double) GA_ABS (lval);
      break;
    case C_FLOAT:
      result = (double) GA_ABS (fval);
      break;

    case C_DBL:
      result = GA_ABS (dval);
      break;

    case C_DCPL:
      result = sqrt (dcval.real * dcval.real + dcval.imag * dcval.imag);
      break;
    default:
      GA::SERVICES.error ((char *)"test_norm_infinity: wrong data type.\n", type);
    }
  if (me == 0)
    {
      if (MISMATCHED (result, norm_infinity)) {
          printf ("not ok.\n");
          GA::SERVICES.error ((char *)"test_norm_infinity:mismatched.", type);
      }
      else {
          printf ("ok.\n");
      }
    }
}